

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::computePrimInfo
          (PrimInfo *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set,
          LinearSpace3fa *space)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  char cVar3;
  runtime_error *this_00;
  anon_class_16_2_f88231f3 computeBounds;
  CentGeomBBox3fa bounds;
  blocked_range<unsigned_long> local_118;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  code *local_d0 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c0;
  undefined1 local_b0 [8];
  task_group_context context;
  
  uVar1 = set->_begin;
  uVar2 = set->_end;
  local_118.my_end = 0x7f8000007f800000;
  local_118.my_begin = 0x7f8000007f800000;
  local_118.my_grainsize = 0xff800000ff800000;
  uStack_100 = 0xff800000ff800000;
  local_f8 = 0x7f8000007f800000;
  uStack_f0 = 0x7f8000007f800000;
  local_e8 = 0xff800000ff800000;
  uStack_e0 = 0xff800000ff800000;
  computeBounds.this = this;
  computeBounds.space = space;
  if (uVar2 - uVar1 < 0x1000) {
    context.my_cpu_ctl_env = uVar1;
    context._8_8_ = uVar2;
    computePrimInfo::anon_class_16_2_f88231f3::operator()
              (&bounds,&computeBounds,(range<unsigned_long> *)&context);
  }
  else {
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_b0 = (undefined1  [8])0x400;
    local_d0[0] = CentGeom<embree::BBox<embree::Vec3fa>_>::merge2;
    local_d0[1] = (code *)&computeBounds;
    local_c0._0_8_ = uVar2;
    local_c0._8_8_ = uVar1;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::CentGeom<embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::CentGeom<embree::BBox<embree::Vec3fa>>,embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,32ul>::computePrimInfo(embree::range<unsigned_long>const&,embree::LinearSpace3<embree::Vec3fa>const&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,32ul>::computePrimInfo(embree::range<unsigned_long>const&,embree::LinearSpace3<embree::Vec3fa>const&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(const&)(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)_1_,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)>
              (&bounds,(d1 *)&local_c0.field_1,&local_118,
               (CentGeom<embree::BBox<embree::Vec3fa>_> *)local_d0,
               (anon_class_16_2_ed117de8_conflict15 *)
               CentGeom<embree::BBox<embree::Vec3fa>_>::merge2,
               (_func_CentGeom<embree::BBox<embree::Vec3fa>_>_CentGeom<embree::BBox<embree::Vec3fa>_>_ptr_CentGeom<embree::BBox<embree::Vec3fa>_>_ptr
                *)&context,(task_group_context *)computeBounds.this);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = bounds.geomBounds.lower.field_0._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = bounds.geomBounds.lower.field_0._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = bounds.geomBounds.upper.field_0._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = bounds.geomBounds.upper.field_0._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = bounds.centBounds.lower.field_0._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = bounds.centBounds.lower.field_0._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = bounds.centBounds.upper.field_0._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = bounds.centBounds.upper.field_0._8_8_;
  uVar1 = set->_end;
  __return_storage_ptr__->begin = set->_begin;
  __return_storage_ptr__->end = uVar1;
  return __return_storage_ptr__;
}

Assistant:

const PrimInfo computePrimInfo(const range<size_t>& set, const LinearSpace3fa& space)
        {
          auto computeBounds = [&](const range<size_t>& r) -> CentGeomBBox3fa
            {
              CentGeomBBox3fa bounds(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                Geometry* mesh = scene->get(prims[i].geomID());
                bounds.extend(mesh->vbounds(space,prims[i].primID()));
              }
              return bounds;
            };
          
          const CentGeomBBox3fa bounds = parallel_reduce(set.begin(), set.end(), size_t(1024), size_t(4096), 
                                                         CentGeomBBox3fa(empty), computeBounds, CentGeomBBox3fa::merge2);

          return PrimInfo(set.begin(),set.end(),bounds);
        }